

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayValue.cpp
# Opt level: O1

void __thiscall ArrayValue::SetAtIndex(ArrayValue *this,Value *value,size_t index)

{
  pointer ppVVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  bool bVar3;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  iVar2 = (*value->_vptr_Value[3])(value);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&local_60,(undefined8 *)CONCAT44(extraout_var,iVar2));
  (**(this->element_type_->super_PrimitiveObject).super_Object._vptr_Object)(&local_40);
  bVar3 = true;
  if (local_58 == local_38) {
    if (local_58 == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp(local_60,local_40,local_58);
      bVar3 = iVar2 != 0;
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (bVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Trying to set value of another type");
  }
  else {
    ppVVar1 = (this->buffer_).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (index < (ulong)((long)(this->buffer_).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3)) {
      ppVVar1[index] = value;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ArrayValue::SetAtIndex(Value* value, size_t index) {
  if (value->GetType()->GetTypename() !=
      this->GetElementType()->GetTypename()) {
    throw std::runtime_error("Trying to set value of another type");
  } else if (index >= buffer_.size()) {
    throw std::runtime_error("Index out of bounds");
  } else {
    buffer_[index] = value;
  }
}